

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O3

int get_cert_by_subject(X509_LOOKUP *xl,int type,X509_NAME *name,X509_OBJECT *ret)

{
  int iVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  CRYPTO_MUTEX *lock;
  void *pvVar6;
  undefined4 *p;
  size_t sVar7;
  undefined8 uVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined4 uVar11;
  char *pcVar12;
  char *b;
  size_t idx;
  BY_DIR_HASH htmp;
  X509_OBJECT stmp;
  anon_union_304_2_131d70c8 data;
  char *local_1b8;
  size_t local_1b0;
  void *local_1a8;
  uint local_1a0;
  uint local_19c;
  undefined4 local_198 [2];
  X509_OBJECT *local_190;
  int *local_188;
  undefined8 *local_180;
  size_t local_178;
  int local_170 [2];
  undefined1 **local_168;
  undefined1 *local_160 [11];
  undefined1 local_108 [16];
  undefined8 local_f8 [12];
  undefined1 local_98 [40];
  undefined8 local_70 [8];
  
  local_1b8 = (char *)0x0;
  if (name == (X509_NAME *)0x0) {
    return 0;
  }
  puVar10 = (undefined8 *)xl->method_data;
  local_170[0] = type;
  if (type == 1) {
    local_160[0] = local_98;
    puVar2 = local_70;
    pcVar12 = "";
  }
  else {
    if (type != 2) {
      iVar1 = 0;
      ERR_put_error(0xb,0,0x85,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                    ,0xe8);
      goto LAB_002127b2;
    }
    puVar2 = local_f8;
    local_160[0] = local_108;
    pcVar12 = "r";
  }
  local_168 = local_160;
  *puVar2 = name;
  local_190 = ret;
  uVar3 = X509_NAME_hash((X509_NAME *)name);
  uVar3 = uVar3 & 0xffffffff;
  uVar4 = X509_NAME_hash_old((X509_NAME *)name);
  local_1a0 = (uint)uVar4;
  uVar8 = CONCAT71((int7)(uVar4 >> 8),1);
  local_180 = puVar10;
  do {
    local_19c = (uint)uVar8;
    sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)*puVar10);
    if (sVar5 != 0) {
      sVar5 = 0;
LAB_00212501:
      lock = (CRYPTO_MUTEX *)OPENSSL_sk_value((OPENSSL_STACK *)*puVar10,sVar5);
      uVar11 = (undefined4)uVar3;
      local_178 = sVar5;
      if ((type == 2) && (*(long *)((long)lock + 0x48) != 0)) {
        local_198[0] = uVar11;
        CRYPTO_MUTEX_lock_read(lock);
        iVar1 = OPENSSL_sk_find(*(OPENSSL_STACK **)((long)lock + 0x48),&local_1b0,local_198,
                                sk_BY_DIR_HASH_call_cmp_func);
        if (iVar1 == 0) {
          uVar4 = 0;
          local_1a8 = (void *)0x0;
        }
        else {
          local_1a8 = OPENSSL_sk_value(*(OPENSSL_STACK **)((long)lock + 0x48),local_1b0);
          uVar4 = (ulong)*(uint *)((long)local_1a8 + 4);
        }
        CRYPTO_MUTEX_unlock_read(lock);
      }
      else {
        uVar4 = 0;
        local_1a8 = (void *)0x0;
      }
      do {
        OPENSSL_free(local_1b8);
        iVar9 = (int)uVar4;
        iVar1 = OPENSSL_asprintf(&local_1b8,"%s/%08x.%s%d",lock[1].__align,uVar3,pcVar12,uVar4);
        if (iVar1 == -1) {
          iVar1 = 0;
          ERR_put_error(0xb,0,7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                        ,0x108);
          local_1b8 = (char *)0x0;
          goto LAB_002127b2;
        }
        if (type == 1) {
          iVar1 = X509_load_cert_file((X509_LOOKUP *)xl,local_1b8,*(int *)((long)lock + 0x40));
LAB_002125e6:
          if (iVar1 == 0) goto LAB_002125ee;
        }
        else if (type == 2) {
          iVar1 = X509_load_crl_file((X509_LOOKUP *)xl,local_1b8,*(int *)((long)lock + 0x40));
          goto LAB_002125e6;
        }
        uVar4 = (ulong)(iVar9 + 1);
      } while( true );
    }
LAB_0021274f:
    iVar1 = 0;
    uVar3 = (ulong)local_1a0;
    uVar8 = 0;
  } while ((local_19c & 1) != 0);
LAB_002127b2:
  OPENSSL_free(local_1b8);
  return iVar1;
LAB_002125ee:
  ERR_clear_error();
  CRYPTO_MUTEX_lock_write(&xl->store_ctx->objs_lock);
  OPENSSL_sk_sort((OPENSSL_STACK *)xl->store_ctx->objs,sk_X509_OBJECT_call_cmp_func);
  iVar1 = OPENSSL_sk_find((OPENSSL_STACK *)xl->store_ctx->objs,&local_1b0,local_170,
                          sk_X509_OBJECT_call_cmp_func);
  if (iVar1 == 0) {
    local_188 = (int *)0x0;
  }
  else {
    local_188 = (int *)OPENSSL_sk_value((OPENSSL_STACK *)xl->store_ctx->objs,local_1b0);
  }
  CRYPTO_MUTEX_unlock_write(&xl->store_ctx->objs_lock);
  if (type != 2) goto LAB_00212722;
  CRYPTO_MUTEX_lock_write(lock);
  pvVar6 = local_1a8;
  if (local_1a8 == (void *)0x0) {
    local_198[0] = uVar11;
    OPENSSL_sk_sort(*(OPENSSL_STACK **)((long)lock + 0x48),sk_BY_DIR_HASH_call_cmp_func);
    iVar1 = OPENSSL_sk_find(*(OPENSSL_STACK **)((long)lock + 0x48),&local_1b0,local_198,
                            sk_BY_DIR_HASH_call_cmp_func);
    if ((iVar1 != 0) &&
       (pvVar6 = OPENSSL_sk_value(*(OPENSSL_STACK **)((long)lock + 0x48),local_1b0),
       pvVar6 != (void *)0x0)) goto LAB_0021267d;
    p = (undefined4 *)OPENSSL_malloc(8);
    if (p == (undefined4 *)0x0) {
      CRYPTO_MUTEX_unlock_write(lock);
LAB_00212806:
      iVar1 = 0;
      goto LAB_002127b2;
    }
    *p = uVar11;
    p[1] = iVar9;
    sVar5 = OPENSSL_sk_push(*(OPENSSL_STACK **)((long)lock + 0x48),p);
    if (sVar5 == 0) {
      CRYPTO_MUTEX_unlock_write(lock);
      OPENSSL_free(p);
      goto LAB_00212806;
    }
    OPENSSL_sk_sort(*(OPENSSL_STACK **)((long)lock + 0x48),sk_BY_DIR_HASH_call_cmp_func);
  }
  else {
LAB_0021267d:
    if (*(int *)((long)pvVar6 + 4) < iVar9) {
      *(int *)((long)pvVar6 + 4) = iVar9;
    }
  }
  CRYPTO_MUTEX_unlock_write(lock);
LAB_00212722:
  puVar10 = local_180;
  if (local_188 != (int *)0x0) {
    local_190->type = *local_188;
    local_190->data = *(anon_union_8_4_ca12f507_for_data *)(local_188 + 2);
    ERR_clear_error();
    iVar1 = 1;
    goto LAB_002127b2;
  }
  sVar5 = local_178 + 1;
  sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)*local_180);
  if (sVar7 <= sVar5) goto LAB_0021274f;
  goto LAB_00212501;
}

Assistant:

static int get_cert_by_subject(X509_LOOKUP *xl, int type, X509_NAME *name,
                               X509_OBJECT *ret) {
  union {
    struct {
      X509 st_x509;
      X509_CINF st_x509_cinf;
    } x509;
    struct {
      X509_CRL st_crl;
      X509_CRL_INFO st_crl_info;
    } crl;
  } data;
  int ok = 0;
  size_t i;
  int k;
  uint32_t h;
  uint32_t hash_array[2];
  int hash_index;
  char *b = NULL;
  X509_OBJECT stmp, *tmp;
  const char *postfix = "";

  if (name == NULL) {
    return 0;
  }

  stmp.type = type;
  BY_DIR *ctx = reinterpret_cast<BY_DIR *>(xl->method_data);
  if (type == X509_LU_X509) {
    data.x509.st_x509.cert_info = &data.x509.st_x509_cinf;
    data.x509.st_x509_cinf.subject = name;
    stmp.data.x509 = &data.x509.st_x509;
    postfix = "";
  } else if (type == X509_LU_CRL) {
    data.crl.st_crl.crl = &data.crl.st_crl_info;
    data.crl.st_crl_info.issuer = name;
    stmp.data.crl = &data.crl.st_crl;
    postfix = "r";
  } else {
    OPENSSL_PUT_ERROR(X509, X509_R_WRONG_LOOKUP_TYPE);
    goto finish;
  }

  hash_array[0] = X509_NAME_hash(name);
  hash_array[1] = X509_NAME_hash_old(name);
  for (hash_index = 0; hash_index < 2; ++hash_index) {
    h = hash_array[hash_index];
    for (i = 0; i < sk_BY_DIR_ENTRY_num(ctx->dirs); i++) {
      BY_DIR_ENTRY *ent;
      size_t idx;
      BY_DIR_HASH htmp, *hent;
      ent = sk_BY_DIR_ENTRY_value(ctx->dirs, i);
      if (type == X509_LU_CRL && ent->hashes) {
        htmp.hash = h;
        CRYPTO_MUTEX_lock_read(&ent->lock);
        if (sk_BY_DIR_HASH_find(ent->hashes, &idx, &htmp)) {
          hent = sk_BY_DIR_HASH_value(ent->hashes, idx);
          k = hent->suffix;
        } else {
          hent = NULL;
          k = 0;
        }
        CRYPTO_MUTEX_unlock_read(&ent->lock);
      } else {
        k = 0;
        hent = NULL;
      }
      for (;;) {
        OPENSSL_free(b);
        if (OPENSSL_asprintf(&b, "%s/%08" PRIx32 ".%s%d", ent->dir, h, postfix,
                             k) == -1) {
          OPENSSL_PUT_ERROR(X509, ERR_R_BUF_LIB);
          b = nullptr;
          goto finish;
        }
        if (type == X509_LU_X509) {
          if ((X509_load_cert_file(xl, b, ent->dir_type)) == 0) {
            // Don't expose the lower level error, All of these boil
            // down to "we could not find a CA".
            ERR_clear_error();
            break;
          }
        } else if (type == X509_LU_CRL) {
          if ((X509_load_crl_file(xl, b, ent->dir_type)) == 0) {
            // Don't expose the lower level error, All of these boil
            // down to "we could not find a CRL".
            ERR_clear_error();
            break;
          }
        }
        // The lack of a CA or CRL will be caught higher up
        k++;
      }

      // we have added it to the cache so now pull it out again
      CRYPTO_MUTEX_lock_write(&xl->store_ctx->objs_lock);
      tmp = NULL;
      sk_X509_OBJECT_sort(xl->store_ctx->objs);
      if (sk_X509_OBJECT_find(xl->store_ctx->objs, &idx, &stmp)) {
        tmp = sk_X509_OBJECT_value(xl->store_ctx->objs, idx);
      }
      CRYPTO_MUTEX_unlock_write(&xl->store_ctx->objs_lock);

      // If a CRL, update the last file suffix added for this

      if (type == X509_LU_CRL) {
        CRYPTO_MUTEX_lock_write(&ent->lock);
        // Look for entry again in case another thread added an entry
        // first.
        if (!hent) {
          htmp.hash = h;
          sk_BY_DIR_HASH_sort(ent->hashes);
          if (sk_BY_DIR_HASH_find(ent->hashes, &idx, &htmp)) {
            hent = sk_BY_DIR_HASH_value(ent->hashes, idx);
          }
        }
        if (!hent) {
          hent = reinterpret_cast<BY_DIR_HASH *>(
              OPENSSL_malloc(sizeof(BY_DIR_HASH)));
          if (hent == NULL) {
            CRYPTO_MUTEX_unlock_write(&ent->lock);
            ok = 0;
            goto finish;
          }
          hent->hash = h;
          hent->suffix = k;
          if (!sk_BY_DIR_HASH_push(ent->hashes, hent)) {
            CRYPTO_MUTEX_unlock_write(&ent->lock);
            OPENSSL_free(hent);
            ok = 0;
            goto finish;
          }
          sk_BY_DIR_HASH_sort(ent->hashes);
        } else if (hent->suffix < k) {
          hent->suffix = k;
        }

        CRYPTO_MUTEX_unlock_write(&ent->lock);
      }

      if (tmp != NULL) {
        ok = 1;
        ret->type = tmp->type;
        OPENSSL_memcpy(&ret->data, &tmp->data, sizeof(ret->data));

        // Clear any errors that might have been raised processing empty
        // or malformed files.
        ERR_clear_error();

        // If we were going to up the reference count, we would need
        // to do it on a perl 'type' basis
        goto finish;
      }
    }
  }
finish:
  OPENSSL_free(b);
  return ok;
}